

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_startEglConfigSet(qpTestLog *log,char *name,char *description)

{
  deBool dVar1;
  int numAttribs;
  qpXmlAttribute attribs [4];
  qpXmlAttribute local_a8;
  char *local_88;
  undefined4 local_80;
  char *local_78;
  undefined8 local_70;
  
  deMutex_lock(log->lock);
  local_a8.name = "Name";
  local_a8.type = QP_XML_ATTRIBUTE_STRING;
  local_a8.intValue = -0x2a6;
  local_a8.boolValue = -1;
  numAttribs = 1;
  if (description != (char *)0x0) {
    local_88 = "Description";
    local_80 = 0;
    local_70 = 0xfffffffffffffd5a;
    numAttribs = 2;
    local_78 = description;
  }
  local_a8.stringValue = name;
  dVar1 = qpXmlWriter_startElement(log->writer,"EglConfigSet",numAttribs,&local_a8);
  if (dVar1 == 0) {
    qpPrintf("qpTestLog_startEglImageSet(): Writing XML failed\n");
  }
  deMutex_unlock(log->lock);
  return (uint)(dVar1 != 0);
}

Assistant:

deBool qpTestLog_startEglConfigSet (qpTestLog* log, const char* name, const char* description)
{
	qpXmlAttribute	attribs[4];
	int				numAttribs = 0;

	DE_ASSERT(log && name);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	if (description)
		attribs[numAttribs++] = qpSetStringAttrib("Description", description);

	/* <EglConfigSet Name="<name>"> */
	if (!qpXmlWriter_startElement(log->writer, "EglConfigSet", numAttribs, attribs))
	{
		qpPrintf("qpTestLog_startEglImageSet(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_push(&log->containerStack, CONTAINERTYPE_EGLCONFIGSET));

	deMutex_unlock(log->lock);
	return DE_TRUE;
}